

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O3

void drawImage6(Array2D<GZ> *px,int w,int h)

{
  long lVar1;
  GZ *pGVar2;
  double dVar3;
  double dVar4;
  char cVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ushort uVar10;
  int i;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  int j;
  int iVar15;
  double dVar16;
  float fVar17;
  double a;
  double dVar18;
  float fVar19;
  float fVar20;
  double dVar21;
  
  lVar6 = _imath_half_to_float_table;
  if (0 < h) {
    lVar1 = px->_sizeY;
    pGVar2 = px->_data;
    uVar12 = 0;
    do {
      if (0 < w) {
        lVar8 = uVar12 * lVar1;
        uVar9 = 0;
        do {
          pGVar2[lVar8 + uVar9].g._h = 0;
          pGVar2[lVar8 + uVar9].z = 0.0;
          iVar11 = 0;
          dVar18 = 0.0;
          uVar14 = 0;
          do {
            dVar3 = 0.0;
            iVar15 = 0;
            do {
              dVar16 = 0.0;
              dVar21 = 0.0;
              uVar13 = 0;
              do {
                uVar7 = uVar13 + 1;
                if (0xfe < uVar13) break;
                dVar4 = dVar21 * dVar21 - dVar16 * dVar16;
                dVar16 = (dVar21 + dVar21) * dVar16 +
                         (dVar3 * 0.3333333432674408 + (double)(int)uVar12) *
                         ((((double)h * 3.5) / (double)w + -1.3333 + 1.3333) / (double)h) + -1.3333;
                dVar21 = (dVar18 * 0.3333333432674408 + (double)(int)uVar9) * (3.5 / (double)w) +
                         -2.5 + dVar4;
                uVar13 = uVar7;
              } while (dVar4 < 100.0);
              fVar19 = (float)(int)uVar7 * 0.00390625 * 5.0;
              fVar17 = (fVar19 - (float)(int)fVar19) + (fVar19 - (float)(int)fVar19);
              fVar20 = (float)(~-(uint)(fVar17 < 1.0) & (uint)(2.0 - fVar17) |
                              (uint)fVar17 & -(uint)(fVar17 < 1.0)) * 4.0 +
                       *(float *)(lVar6 + (uVar14 & 0xffff) * 4);
              fVar17 = ABS(fVar20);
              uVar13 = (uint)fVar20 >> 0x10 & 0x8000;
              uVar14 = (ulong)uVar13;
              if ((uint)fVar17 < 0x38800000) {
                if (0x33000000 < (uint)fVar17) {
                  uVar7 = (uint)fVar17 & 0x7fffff | 0x800000;
                  cVar5 = (char)((uint)fVar17 >> 0x17);
                  uVar13 = uVar13 | uVar7 >> (0x7eU - cVar5 & 0x1f);
                  uVar14 = (ulong)uVar13;
                  if (0x80000000 < uVar7 << (cVar5 + 0xa2U & 0x1f)) {
                    uVar14 = (ulong)(uVar13 + 1);
                  }
                }
              }
              else if ((uint)fVar17 < 0x7f800000) {
                if ((uint)fVar17 < 0x477ff000) {
                  uVar14 = (ulong)((int)fVar17 + 0x8000fff + (uint)(((uint)fVar17 >> 0xd & 1) != 0)
                                   >> 0xd | uVar13);
                }
                else {
                  uVar14 = (ulong)(uVar13 | 0x7c00);
                }
              }
              else {
                uVar14 = (ulong)(uVar13 | 0x7c00);
                if (fVar17 != INFINITY) {
                  uVar7 = (uint)fVar17 >> 0xd & 0x3ff;
                  uVar14 = (ulong)(uVar13 | 0x7c00 | uVar7 | (uint)(uVar7 == 0));
                }
              }
              pGVar2[lVar8 + uVar9].g._h = (uint16_t)uVar14;
              pGVar2[lVar8 + uVar9].z = fVar19;
              dVar3 = dVar3 + 1.0;
              iVar15 = iVar15 + 1;
            } while (iVar15 != 3);
            dVar18 = dVar18 + 1.0;
            iVar11 = iVar11 + 1;
          } while (iVar11 != 3);
          fVar20 = *(float *)(lVar6 + (uVar14 & 0xffff) * 4) * 0.11111112;
          fVar17 = ABS(fVar20);
          uVar10 = (ushort)((uint)fVar20 >> 0x10) & 0x8000;
          if ((uint)fVar17 < 0x38800000) {
            if ((0x33000000 < (uint)fVar17) &&
               (cVar5 = (char)((uint)fVar17 >> 0x17), uVar13 = (uint)fVar17 & 0x7fffff | 0x800000,
               uVar10 = uVar10 | (ushort)(uVar13 >> (0x7eU - cVar5 & 0x1f)),
               0x80000000 < uVar13 << (cVar5 + 0xa2U & 0x1f))) {
              uVar10 = uVar10 + 1;
            }
          }
          else if ((uint)fVar17 < 0x7f800000) {
            if ((uint)fVar17 < 0x477ff000) {
              uVar10 = (ushort)((int)fVar17 + 0x8000fff + (uint)(((uint)fVar17 >> 0xd & 1) != 0) >>
                               0xd) | uVar10;
            }
            else {
              uVar10 = uVar10 | 0x7c00;
            }
          }
          else {
            uVar10 = uVar10 | 0x7c00;
            if (fVar17 != INFINITY) {
              uVar13 = (uint)fVar17 >> 0xd & 0x3ff;
              uVar10 = uVar10 | (ushort)uVar13 | (ushort)(uVar13 == 0);
            }
          }
          pGVar2[lVar8 + uVar9].g._h = uVar10;
          pGVar2[lVar8 + uVar9].z = fVar19 * 0.11111112;
          uVar9 = uVar9 + 1;
        } while (uVar9 != (uint)w);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != (uint)h);
  }
  return;
}

Assistant:

void
mndl (
    Array2D<P>& px,
    int         w,
    int         h,
    int         xMin,
    int         xMax,
    int         yMin,
    int         yMax,
    int         xSamples,
    int         ySamples,
    double      rMin,
    double      rMax,
    double      iMin,
    double      aspect,
    double      rSeed,
    double      iSeed)
{
    if (xSamples > 6) xSamples = 6;

    if (ySamples > 6) ySamples = 6;

    double iMax = iMin + aspect * (rMax - rMin) * h / w;
    double sx   = double (rMax - rMin) / w;
    double sy   = double (iMax - iMin) / h;
    double tx   = 1.f / xSamples;
    double ty   = 1.f / ySamples;
    float  t    = tx * ty;

    for (int y = yMin; y < yMax; ++y)
    {
        for (int x = xMin; x < xMax; ++x)
        {
            P& p = px[y - yMin][x - xMin];

            clear (p);

            for (int i = 0; i < xSamples; ++i)
            {
                for (int j = 0; j < ySamples; ++j)
                {
                    const double a    = rMin + sx * (x + i * tx);
                    const double b    = iMin + sy * (y + j * ty);
                    const double sMax = 100;
                    const int    kMax = 256;
                    double       r    = rSeed;
                    double       i    = iSeed;
                    double       s    = 0;
                    int          k    = 0;

                    while (k < kMax && s < sMax)
                    {
                        s = r * r - i * i;
                        i = 2 * r * i + b;
                        r = s + a;
                        k++;
                    }

                    add (k / float (kMax), p);
                }
            }

            scale (t, p);
        }
    }
}